

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void exprAnalyze(SrcList *pSrc,WhereClause *pWC,int idxTerm)

{
  u32 *puVar1;
  WhereMaskSet *pMaskSet;
  byte *pbVar2;
  Bitmask *pBVar3;
  undefined2 uVar4;
  WhereInfo *pWVar5;
  Parse *pParse;
  sqlite3 *db;
  WhereOrInfo *pIn;
  sqlite3 *psVar6;
  Parse *pParse_00;
  Vdbe *pVVar7;
  undefined8 *puVar8;
  code *pcVar9;
  bool bVar10;
  char cVar11;
  byte bVar12;
  byte bVar13;
  ushort uVar14;
  short sVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  Bitmask BVar20;
  WhereOrInfo *pExpr;
  CollSeq *pCVar21;
  FuncDef *pFVar22;
  WhereOrInfo *pWC_00;
  sqlite3_value *pVal;
  Expr *p;
  Expr *pEVar23;
  byte *pbVar24;
  size_t sVar25;
  Expr *pEVar26;
  ExprList *pEVar27;
  ulong uVar28;
  Select *pSVar29;
  Op *pOVar30;
  byte bVar31;
  ExprList_item *pEVar32;
  long lVar33;
  long lVar34;
  WhereOrInfo *pWVar35;
  byte extraout_DL;
  u8 uVar36;
  uint uVar37;
  WhereTerm *pWVar38;
  uint uVar39;
  uint op;
  uint op_00;
  WhereTerm *pWVar40;
  SrcList *pSVar41;
  SrcList *pSVar42;
  ulong uVar43;
  char cVar44;
  byte in_R11B;
  char *pcVar45;
  u8 uVar46;
  WhereTerm *pWVar47;
  ushort uVar48;
  SrcList *p_00;
  WhereClause **ppWVar49;
  bool bVar50;
  bool bVar51;
  int aiCurCol [2];
  ulong local_c8;
  Expr *local_b0;
  Token local_58;
  Expr *local_48;
  ulong local_40;
  undefined1 local_38 [8];
  
  pWVar5 = pWC->pWInfo;
  pParse = pWVar5->pParse;
  db = pParse->db;
  if (db->mallocFailed != '\0') {
    return;
  }
  pExpr = (WhereOrInfo *)(ulong)(uint)idxTerm;
  pWVar40 = pWC->a;
  pMaskSet = &pWVar5->sMaskSet;
  pIn = (WhereOrInfo *)pWVar40[idxTerm].pExpr;
  pEVar23 = *(Expr **)&(pIn->wc).op;
  if (pEVar23 == (Expr *)0x0) {
    local_c8 = 0;
  }
  else {
    local_c8 = sqlite3WhereExprUsageNN(pMaskSet,pEVar23);
  }
  pWVar40 = pWVar40 + idxTerm;
  bVar12 = *(byte *)&(pIn->wc).pWInfo;
  uVar39 = (uint)bVar12;
  uVar37 = (uint)bVar12;
  if (bVar12 == 0x32) {
    pWVar40->prereqRight = 0;
  }
  else {
    if (bVar12 == 0x31) {
      iVar16 = sqlite3ExprCheckIN(pParse,(Expr *)pIn);
      if (iVar16 != 0) {
        return;
      }
      pSVar29 = (Select *)((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pList;
      if (((ulong)(pIn->wc).pWInfo & 0x80000000000) == 0) {
        BVar20 = sqlite3WhereExprListUsage(pMaskSet,(ExprList *)pSVar29);
      }
      else {
        BVar20 = exprSelectUsage(pMaskSet,pSVar29);
      }
    }
    else {
      pEVar23 = *(Expr **)&(pIn->wc).nSlot;
      if (pEVar23 == (Expr *)0x0) {
        BVar20 = 0;
      }
      else {
        BVar20 = sqlite3WhereExprUsageNN(pMaskSet,pEVar23);
      }
    }
    pWVar40->prereqRight = BVar20;
  }
  pMaskSet->bVarSelect = 0;
  BVar20 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pIn);
  if (pMaskSet->bVarSelect != 0) {
    pbVar24 = (byte *)((long)&pWVar40->wtFlags + 1);
    *pbVar24 = *pbVar24 | 0x10;
  }
  if (((ulong)(pIn->wc).pWInfo & 0x100000000) == 0) {
    local_40 = 0;
  }
  else {
    lVar34 = (long)(pWVar5->sMaskSet).n;
    if (0 < lVar34) {
      lVar33 = 0;
      do {
        if ((pWVar5->sMaskSet).ix[lVar33] == (int)*(i16 *)((long)&(pIn->wc).aStatic[0].pWC + 4)) {
          local_40 = 1L << ((byte)lVar33 & 0x3f);
          goto LAB_001893bf;
        }
        lVar33 = lVar33 + 1;
      } while (lVar34 != lVar33);
    }
    local_40 = 0;
LAB_001893bf:
    BVar20 = BVar20 | local_40;
    if (local_40 <= BVar20 >> 1) {
      sqlite3ErrorMsg(pParse,"ON clause references tables to its right");
      return;
    }
    local_40 = local_40 - 1;
  }
  pWVar40->prereqAll = BVar20;
  pWVar40->iParent = -1;
  pWVar40->leftCursor = -1;
  pWVar40->eOperator = 0;
  op = (uint)bVar12;
  if ((op < 0x3a) && ((0x3e6200000000000U >> ((ulong)op & 0x3f) & 1) != 0)) {
    pEVar23 = *(Expr **)&(pIn->wc).op;
    while ((pEVar23 != (Expr *)0x0 && ((pEVar23->flags >> 0xc & 1) != 0))) {
      if ((pEVar23->flags >> 0x12 & 1) == 0) {
        pEVar32 = (ExprList_item *)&pEVar23->pLeft;
      }
      else {
        pEVar32 = ((pEVar23->x).pList)->a;
      }
      pEVar23 = pEVar32->pExpr;
    }
    pExpr = *(WhereOrInfo **)&(pIn->wc).nSlot;
    while ((pExpr != (WhereOrInfo *)0x0 &&
           (uVar37 = *(uint *)((long)&(pExpr->wc).pWInfo + 4), (uVar37 >> 0xc & 1) != 0))) {
      if ((uVar37 >> 0x12 & 1) == 0) {
        ppWVar49 = (WhereClause **)&(pExpr->wc).op;
      }
      else {
        ppWVar49 = &((pExpr->wc).a)->pWC;
      }
      pExpr = (WhereOrInfo *)*ppWVar49;
    }
    uVar48 = 0x800;
    if ((pWVar40->prereqRight & local_c8) == 0) {
      uVar48 = 0x1fff;
    }
    if (0 < pWVar40->iField) {
      pEVar23 = ((pEVar23->x).pList)->a[pWVar40->iField - 1].pExpr;
    }
    iVar16 = exprMightBeIndexed(pSrc,local_c8,(int *)&local_58,pEVar23,op);
    op_00 = (uint)bVar12;
    if (iVar16 != 0) {
      pWVar40->leftCursor = (int)local_58.z;
      (pWVar40->u).leftColumn = local_58.z._4_4_;
      if (op == 0x2d) {
        uVar14 = 0x80;
      }
      else if (op_00 == 0x31) {
        uVar14 = 1;
      }
      else if (op_00 == 0x32) {
        uVar14 = 0x100;
      }
      else {
        uVar14 = (ushort)(2 << (bVar12 - 0x35 & 0x1f));
      }
      pWVar40->eOperator = uVar48 & uVar14;
    }
    if (op_00 == 0x2d) {
      pbVar24 = (byte *)((long)&pWVar40->wtFlags + 1);
      *pbVar24 = *pbVar24 | 8;
    }
    bVar50 = true;
    uVar37 = uVar39;
    if (pExpr != (WhereOrInfo *)0x0) {
      iVar16 = exprMightBeIndexed(pSrc,pWVar40->prereqRight,(int *)&local_58,(Expr *)pExpr,op_00);
      if (iVar16 != 0) {
        pWVar38 = pWVar40;
        if (pWVar40->leftCursor < 0) {
          uVar39 = 0;
          pExpr = pIn;
        }
        else {
          if (pIn == (WhereOrInfo *)0x0) {
            pExpr = (WhereOrInfo *)0x0;
          }
          else {
            pExpr = (WhereOrInfo *)exprDup(db,(Expr *)pIn,0,(u8 **)0x0);
          }
          if (db->mallocFailed == '\0') {
            iVar16 = whereClauseInsert(pWC,(Expr *)pExpr,3);
            if (iVar16 == 0) goto LAB_0018977d;
            pWVar40 = pWC->a;
            pWVar38 = pWVar40 + iVar16;
            pWVar40[iVar16].iParent = idxTerm;
            pWVar40[iVar16].truthProb = pWVar40[idxTerm].truthProb;
            pWVar40[idxTerm].nChild = pWVar40[idxTerm].nChild + '\x01';
            if (op_00 == 0x2d) {
              pbVar24 = (byte *)((long)&pWVar38->wtFlags + 1);
              *pbVar24 = *pbVar24 | 8;
            }
            *(byte *)&pWVar40[idxTerm].wtFlags = (byte)pWVar40[idxTerm].wtFlags | 8;
            pWVar40 = pWVar40 + idxTerm;
            iVar16 = termIsEquivalence(pParse,(Expr *)pExpr);
            bVar50 = true;
            if (iVar16 == 0) {
              uVar39 = 0;
            }
            else {
              pbVar24 = (byte *)((long)&pWVar40->eOperator + 1);
              *pbVar24 = *pbVar24 | 8;
              uVar39 = 0x800;
            }
          }
          else {
            if (pExpr != (WhereOrInfo *)0x0) {
              sqlite3ExprDeleteNN(db,(Expr *)pExpr);
            }
LAB_0018977d:
            uVar39 = 0;
            bVar50 = false;
          }
          if (!bVar50) {
            bVar50 = false;
            uVar37 = uVar39;
            goto LAB_00189870;
          }
        }
        pEVar23 = *(Expr **)&(pExpr->wc).op;
        pEVar26 = *(Expr **)&(pExpr->wc).nSlot;
        uVar37 = pEVar26->flags;
        if (((pEVar23->flags ^ uVar37) >> 8 & 1) == 0) {
          if ((uVar37 >> 8 & 1) == 0) {
            pCVar21 = sqlite3ExprCollSeq(pParse,pEVar23);
            if (pCVar21 != (CollSeq *)0x0) {
              puVar1 = &(*(Expr **)&(pExpr->wc).op)->flags;
              *puVar1 = *puVar1 | 0x100;
            }
          }
          else {
            pEVar26->flags = uVar37 & 0xfffffeff;
          }
        }
        pEVar23 = *(Expr **)&(pExpr->wc).nSlot;
        *(Expr **)&(pExpr->wc).nSlot = *(Expr **)&(pExpr->wc).op;
        *(Expr **)&(pExpr->wc).op = pEVar23;
        bVar12 = *(byte *)&(pExpr->wc).pWInfo;
        if (0x35 < bVar12) {
          *(byte *)&(pExpr->wc).pWInfo = (bVar12 - 0x36 ^ 2) + 0x36;
        }
        pWVar38->leftCursor = (int)local_58.z;
        (pWVar38->u).leftColumn = local_58.z._4_4_;
        pWVar38->prereqRight = local_c8 | local_40;
        pWVar38->prereqAll = BVar20;
        uVar46 = *(u8 *)&(pExpr->wc).pWInfo;
        if (uVar46 == '-') {
          sVar15 = 0x80;
        }
        else if (uVar46 == '1') {
          sVar15 = 1;
        }
        else if (uVar46 == '2') {
          sVar15 = 0x100;
        }
        else {
          sVar15 = (short)(2 << (uVar46 - 0x35 & 0x1f));
        }
        pWVar38->eOperator = uVar48 & (short)uVar39 + sVar15;
      }
      bVar50 = true;
      uVar37 = uVar39;
    }
LAB_00189870:
    if (!bVar50) {
      return;
    }
  }
  else {
    uVar46 = *(u8 *)&(pIn->wc).pWInfo;
    if (uVar46 == '+') {
      pWVar5 = pWC->pWInfo;
      pWVar40 = pWC->a;
      pParse_00 = pWVar5->pParse;
      psVar6 = pParse_00->db;
      local_48 = pWVar40[idxTerm].pExpr;
      pWC_00 = (WhereOrInfo *)sqlite3DbMallocZero(psVar6,0x230);
      pWVar40[idxTerm].u.pOrInfo = pWC_00;
      if (pWC_00 != (WhereOrInfo *)0x0) {
        pWVar40 = pWVar40 + idxTerm;
        *(byte *)&pWVar40->wtFlags = (byte)pWVar40->wtFlags | 0x10;
        memset((WhereTerm *)((long)&pWC_00->wc + 0x28),0,0x200);
        (pWC_00->wc).pWInfo = pWVar5;
        *(u8 *)((long)&pWC_00->wc + 0x11) = '\0';
        *(WhereClause **)((long)&pWC_00->wc + 8) = (WhereClause *)0x0;
        *(undefined8 *)((long)&pWC_00->wc + 0x14) = 0x800000000;
        *(WhereTerm **)((long)&pWC_00->wc + 0x20) = (WhereTerm *)((long)&pWC_00->wc + 0x28);
        sqlite3WhereSplit((WhereClause *)pWC_00,local_48,'+');
        iVar16 = *(int *)((long)&pWC_00->wc + 0x14);
        if (0 < iVar16) {
          iVar16 = iVar16 + 1;
          do {
            exprAnalyze(pSrc,(WhereClause *)pWC_00,iVar16 + -2);
            iVar16 = iVar16 + -1;
          } while (1 < iVar16);
        }
        pExpr = (WhereOrInfo *)pSrc;
        if (psVar6->mallocFailed == '\0') {
          iVar16 = *(int *)((long)&pWC_00->wc + 0x14);
          if (iVar16 < 1) {
            bVar50 = true;
            BVar20 = 0xffffffffffffffff;
            local_c8 = 0xffffffffffffffff;
            pWVar38 = pWVar40;
          }
          else {
            pWVar38 = *(WhereTerm **)((long)&pWC_00->wc + 0x20);
            local_c8 = 0xffffffffffffffff;
            BVar20 = 0xffffffffffffffff;
            do {
              if ((pWVar38->eOperator & 0x1ff) == 0) {
                pWVar35 = (WhereOrInfo *)sqlite3DbMallocRawNN(psVar6,0x228);
                if (pWVar35 != (WhereOrInfo *)0x0) {
                  (pWVar38->u).pOrInfo = pWVar35;
                  *(byte *)&pWVar38->wtFlags = (byte)pWVar38->wtFlags | 0x20;
                  pWVar38->eOperator = 0x400;
                  pWVar47 = (pWVar35->wc).aStatic;
                  memset(pWVar47,0,0x200);
                  (pWVar35->wc).pWInfo = pWC->pWInfo;
                  (pWVar35->wc).hasOr = '\0';
                  (pWVar35->wc).pOuter = (WhereClause *)0x0;
                  (pWVar35->wc).nTerm = 0;
                  (pWVar35->wc).nSlot = 8;
                  (pWVar35->wc).a = pWVar47;
                  sqlite3WhereSplit((WhereClause *)pWVar35,pWVar38->pExpr,',');
                  iVar17 = (pWVar35->wc).nTerm;
                  if (0 < iVar17) {
                    iVar17 = iVar17 + 1;
                    do {
                      exprAnalyze(pSrc,(WhereClause *)pWVar35,iVar17 + -2);
                      iVar17 = iVar17 + -1;
                    } while (1 < iVar17);
                  }
                  (pWVar35->wc).pOuter = pWC;
                  if (psVar6->mallocFailed == '\0') {
                    iVar17 = (pWVar35->wc).nTerm;
                    if (iVar17 < 1) {
                      uVar28 = 0;
                    }
                    else {
                      pWVar47 = (pWVar35->wc).a;
                      iVar19 = 0;
                      uVar28 = 0;
                      do {
                        uVar43 = (ulong)pWVar47->pExpr->op;
                        if (((uVar43 < 0x3a) && ((0x3e6200000000000U >> (uVar43 & 0x3f) & 1) != 0))
                           || (pWVar47->eOperator == 0x40)) {
                          lVar34 = (long)(pWVar5->sMaskSet).n;
                          if (0 < lVar34) {
                            lVar33 = 0;
                            do {
                              if ((pWVar5->sMaskSet).ix[lVar33] == pWVar47->leftCursor) {
                                uVar43 = 1L << ((byte)lVar33 & 0x3f);
                                goto LAB_00189ee6;
                              }
                              lVar33 = lVar33 + 1;
                            } while (lVar34 != lVar33);
                          }
                          uVar43 = 0;
LAB_00189ee6:
                          uVar28 = uVar28 | uVar43;
                        }
                        iVar19 = iVar19 + 1;
                        pWVar47 = pWVar47 + 1;
                      } while (iVar19 != iVar17);
                    }
                  }
                  else {
                    uVar28 = 0;
                  }
                  BVar20 = BVar20 & uVar28;
                  pExpr = pWVar35;
                }
                local_c8 = 0;
              }
              else if ((pWVar38->wtFlags & 8) == 0) {
                iVar17 = (pWVar5->sMaskSet).n;
                lVar34 = (long)iVar17;
                if (0 < lVar34) {
                  lVar33 = 0;
                  do {
                    if ((pWVar5->sMaskSet).ix[lVar33] == pWVar38->leftCursor) {
                      uVar28 = 1L << ((byte)lVar33 & 0x3f);
                      goto LAB_00189e42;
                    }
                    lVar33 = lVar33 + 1;
                  } while (lVar34 != lVar33);
                }
                uVar28 = 0;
LAB_00189e42:
                if ((pWVar38->wtFlags & 2) != 0) {
                  if (0 < iVar17) {
                    lVar33 = 0;
                    do {
                      if ((pWVar5->sMaskSet).ix[lVar33] ==
                          (pWC_00->wc).a[pWVar38->iParent].leftCursor) {
                        uVar43 = 1L << ((byte)lVar33 & 0x3f);
                        goto LAB_00189f09;
                      }
                      lVar33 = lVar33 + 1;
                    } while (lVar34 != lVar33);
                  }
                  uVar43 = 0;
LAB_00189f09:
                  uVar28 = uVar28 | uVar43;
                }
                BVar20 = BVar20 & uVar28;
                local_c8 = local_c8 & uVar28;
                if ((pWVar38->eOperator & 2) == 0) {
                  local_c8 = 0;
                }
              }
              bVar50 = BVar20 != 0;
              if (iVar16 < 2) break;
              iVar16 = iVar16 + -1;
              pWVar38 = pWVar38 + 1;
            } while (BVar20 != 0);
          }
          pWC_00->indexable = BVar20;
          pWVar40->eOperator = 0x200;
          pWVar40 = pWVar38;
          if ((bVar50) && (pWC->hasOr = '\x01', (pWC_00->wc).nTerm == 2)) {
            lVar34 = 0;
            while( true ) {
              pWVar47 = (pWC_00->wc).a;
              if (pWVar47->eOperator == 0x400) {
                if (lVar34 < (((pWVar47->u).pOrInfo)->wc).nTerm) {
                  pWVar47 = (((pWVar47->u).pOrInfo)->wc).a + lVar34;
                }
                else {
                  pWVar47 = (WhereTerm *)0x0;
                }
              }
              else if (lVar34 != 0) {
                pWVar47 = (WhereTerm *)0x0;
              }
              pWVar40 = pWVar38;
              if (pWVar47 == (WhereTerm *)0x0) break;
              lVar34 = lVar34 + 1;
              lVar33 = 0;
              while( true ) {
                pWVar40 = (pWC_00->wc).a;
                if (pWVar40[1].eOperator == 0x400) {
                  if (lVar33 < ((pWVar40[1].u.pOrInfo)->wc).nTerm) {
                    pWVar40 = ((pWVar40[1].u.pOrInfo)->wc).a + lVar33;
                  }
                  else {
                    pWVar40 = (WhereTerm *)0x0;
                  }
                }
                else {
                  pWVar40 = pWVar40 + 1;
                  if (lVar33 != 0) {
                    pWVar40 = (WhereTerm *)0x0;
                  }
                }
                if (pWVar40 == (WhereTerm *)0x0) break;
                lVar33 = lVar33 + 1;
                if (((pWVar47->eOperator & 0x3e) != 0) && ((pWVar40->eOperator & 0x3e) != 0)) {
                  uVar48 = pWVar40->eOperator | pWVar47->eOperator;
                  uVar37 = (uint)uVar48;
                  pExpr = (WhereOrInfo *)(ulong)uVar48;
                  if (((uVar48 & 0xffe5) == 0 || (uVar48 & 0xffd9) == 0) &&
                     ((iVar16 = sqlite3ExprCompare((Parse *)0x0,pWVar47->pExpr->pLeft,
                                                   pWVar40->pExpr->pLeft,-1), iVar16 == 0 &&
                      (iVar16 = sqlite3ExprCompare((Parse *)0x0,pWVar47->pExpr->pRight,
                                                   pWVar40->pExpr->pRight,-1), iVar16 == 0)))) {
                    pWVar35 = (WhereOrInfo *)0x8;
                    if ((uVar48 & 0x18) == 0) {
                      pWVar35 = (WhereOrInfo *)0x20;
                    }
                    pExpr = (WhereOrInfo *)(ulong)uVar37;
                    if ((uVar37 + 0x3f & uVar37) != 0) {
                      pExpr = pWVar35;
                    }
                    if (pWVar47->pExpr == (Expr *)0x0) {
                      pEVar23 = (Expr *)0x0;
                    }
                    else {
                      pEVar23 = exprDup(pWC->pWInfo->pParse->db,pWVar47->pExpr,0,(u8 **)0x0);
                    }
                    if (pEVar23 != (Expr *)0x0) {
                      bVar12 = 0;
                      do {
                        bVar13 = bVar12;
                        bVar12 = bVar13 + 1;
                      } while (2 << (bVar13 & 0x1f) != (int)pExpr);
                      pEVar23->op = bVar13 + 0x35;
                      iVar16 = whereClauseInsert(pWC,pEVar23,3);
                      exprAnalyze(pSrc,pWC,iVar16);
                      pExpr = (WhereOrInfo *)pWC;
                    }
                  }
                }
              }
              pWVar38 = (WhereTerm *)0x0;
            }
          }
          if (local_c8 != 0) {
            pExpr = (WhereOrInfo *)0xffffffff;
            iVar16 = -1;
            bVar50 = false;
            iVar17 = 0;
            do {
              pWVar38 = (pWC_00->wc).a;
              iVar18 = (pWC_00->wc).nTerm;
              iVar19 = iVar18 + -1;
              if (0 < iVar18) {
                do {
                  *(byte *)&pWVar38->wtFlags = (byte)pWVar38->wtFlags & 0xbf;
                  uVar37 = pWVar38->leftCursor;
                  if (uVar37 != (uint)pExpr) {
                    lVar34 = (long)(pWVar5->sMaskSet).n;
                    if (0 < lVar34) {
                      lVar33 = 0;
                      do {
                        if ((pWVar5->sMaskSet).ix[lVar33] == uVar37) {
                          uVar28 = 1L << ((byte)lVar33 & 0x3f);
                          goto LAB_0018a691;
                        }
                        lVar33 = lVar33 + 1;
                      } while (lVar34 != lVar33);
                    }
                    uVar28 = 0;
LAB_0018a691:
                    if ((local_c8 & uVar28) != 0) {
                      iVar16 = (pWVar38->u).leftColumn;
                      local_b0 = pWVar38->pExpr->pLeft;
                      pExpr = (WhereOrInfo *)(ulong)uVar37;
                      bVar10 = true;
                      goto LAB_0018a6cf;
                    }
                  }
                  pWVar38 = pWVar38 + 1;
                  bVar10 = 0 < iVar19;
                  iVar19 = iVar19 + -1;
                } while (bVar10);
                iVar19 = -1;
              }
              bVar10 = false;
              local_b0 = (Expr *)0x0;
LAB_0018a6cf:
              if (bVar10) {
                if (iVar19 < 0) {
                  bVar50 = true;
                }
                else {
                  do {
                    if (pWVar38->leftCursor == (int)pExpr) {
                      bVar51 = false;
                      bVar50 = false;
                      if ((pWVar38->u).leftColumn == iVar16) {
                        if (iVar16 == -2) {
                          iVar18 = sqlite3ExprCompare(pParse_00,pWVar38->pExpr->pLeft,local_b0,-1);
                          bVar51 = false;
                          bVar50 = false;
                          if (iVar18 != 0) goto LAB_0018a76a;
                        }
                        bVar12 = sqlite3ExprAffinity(pWVar38->pExpr->pRight);
                        pWVar40 = (WhereTerm *)(ulong)bVar12;
                        bVar13 = sqlite3ExprAffinity(pWVar38->pExpr->pLeft);
                        if (bVar12 != 0) {
                          bVar51 = false;
                          bVar50 = false;
                          if (bVar12 != bVar13) goto LAB_0018a76a;
                        }
                        *(byte *)&pWVar38->wtFlags = (byte)pWVar38->wtFlags | 0x40;
                        goto LAB_0018a763;
                      }
                    }
                    else {
                      *(byte *)&pWVar38->wtFlags = (byte)pWVar38->wtFlags & 0xbf;
LAB_0018a763:
                      bVar50 = true;
                      bVar51 = true;
                    }
LAB_0018a76a:
                    if (!bVar51) break;
                    pWVar38 = pWVar38 + 1;
                    bVar51 = 0 < iVar19;
                    iVar19 = iVar19 + -1;
                  } while (bVar51);
                }
              }
            } while ((bVar10) && (bVar10 = iVar17 == 0, iVar17 = iVar17 + 1, bVar10 && !bVar50));
            if (bVar50) {
              iVar16 = (pWC_00->wc).nTerm;
              if (iVar16 < 1) {
                pEVar27 = (ExprList *)0x0;
                pEVar23 = (Expr *)0x0;
              }
              else {
                pExpr = (WhereOrInfo *)(pWC_00->wc).a;
                iVar16 = iVar16 + 1;
                pEVar23 = (Expr *)0x0;
                pEVar27 = (ExprList *)0x0;
                do {
                  if ((((WhereTerm *)pExpr)->wtFlags & 0x40) != 0) {
                    pEVar23 = ((WhereTerm *)pExpr)->pExpr->pRight;
                    if (pEVar23 == (Expr *)0x0) {
                      pEVar23 = (Expr *)0x0;
                    }
                    else {
                      pEVar23 = exprDup(psVar6,pEVar23,0,(u8 **)0x0);
                    }
                    pEVar27 = sqlite3ExprListAppend(pWVar5->pParse,pEVar27,pEVar23);
                    pEVar23 = ((WhereTerm *)pExpr)->pExpr->pLeft;
                  }
                  pExpr = (WhereOrInfo *)((long)pExpr + 0x40);
                  iVar16 = iVar16 + -1;
                } while (1 < iVar16);
              }
              if (pEVar23 == (Expr *)0x0) {
                pEVar23 = (Expr *)0x0;
              }
              else {
                pEVar23 = exprDup(psVar6,pEVar23,0,(u8 **)0x0);
              }
              pEVar23 = sqlite3PExpr(pParse_00,0x31,pEVar23,(Expr *)0x0);
              if (pEVar23 == (Expr *)0x0) {
                if (pEVar27 != (ExprList *)0x0) {
                  exprListDeleteNN(psVar6,pEVar27);
                }
              }
              else {
                pEVar23->flags = pEVar23->flags | local_48->flags & 1;
                pEVar23->iRightJoinTable = local_48->iRightJoinTable;
                (pEVar23->x).pList = pEVar27;
                uVar37 = whereClauseInsert(pWC,pEVar23,3);
                pWVar40 = (WhereTerm *)(ulong)uVar37;
                exprAnalyze(pSrc,pWC,uVar37);
                pWVar38 = pWC->a;
                pWVar38[(int)uVar37].iParent = idxTerm;
                pWVar38[(int)uVar37].truthProb = pWVar38[idxTerm].truthProb;
                pWVar38[idxTerm].nChild = pWVar38[idxTerm].nChild + '\x01';
              }
            }
          }
        }
      }
      uVar37 = (uint)pWVar40;
      pWVar40 = pWC->a + idxTerm;
    }
    else if ((uVar46 == '0') && (pWC->op == ',')) {
      pEVar32 = ((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pList->a;
      pExpr = (WhereOrInfo *)0x0;
      do {
        bVar12 = *(byte *)((long)&pExpr[0xc57].wc.aStatic[4].iParent + 1);
        pEVar23 = *(Expr **)&(pIn->wc).op;
        if (pEVar23 == (Expr *)0x0) {
          pEVar23 = (Expr *)0x0;
        }
        else {
          pEVar23 = exprDup(db,pEVar23,0,(u8 **)0x0);
        }
        if (pEVar32->pExpr == (Expr *)0x0) {
          pEVar26 = (Expr *)0x0;
        }
        else {
          pEVar26 = exprDup(db,pEVar32->pExpr,0,(u8 **)0x0);
        }
        pEVar23 = sqlite3PExpr(pParse,(uint)bVar12,pEVar23,pEVar26);
        if (pEVar23 != (Expr *)0x0) {
          pEVar23->flags = pEVar23->flags | *(u32 *)((long)&(pIn->wc).pWInfo + 4) & 1;
          pEVar23->iRightJoinTable = *(i16 *)((long)&(pIn->wc).aStatic[0].pWC + 4);
        }
        uVar37 = whereClauseInsert(pWC,pEVar23,3);
        exprAnalyze(pSrc,pWC,uVar37);
        pWVar40 = pWC->a;
        pWVar40[(int)uVar37].iParent = idxTerm;
        pWVar40[(int)uVar37].truthProb = pWVar40[idxTerm].truthProb;
        pWVar40[idxTerm].nChild = pWVar40[idxTerm].nChild + '\x01';
        pExpr = (WhereOrInfo *)((long)&(pExpr->wc).pWInfo + 1);
        pEVar32 = pEVar32 + 1;
      } while (pExpr == (WhereOrInfo *)0x1);
      pWVar40 = pWVar40 + idxTerm;
    }
  }
  bVar12 = (byte)uVar37;
  bVar13 = (byte)pExpr;
  if (pWC->op == ',') {
    psVar6 = pParse->db;
    local_c8._0_1_ = (byte)pParse;
    cVar44 = '\x01';
    bVar50 = true;
    if (*(u8 *)&(pIn->wc).pWInfo == 0xa1) {
      pFVar22 = (FuncDef *)((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pList;
      if (pFVar22 == (FuncDef *)0x0) {
LAB_00189a5a:
        cVar44 = '\x01';
        local_c8._0_1_ = (byte)pFVar22;
        bVar50 = true;
      }
      else {
        iVar16 = *(int *)pFVar22;
        pFVar22 = sqlite3FindFunction(psVar6,((anon_union_8_2_443a03b8_for_u *)&(pIn->wc).pOuter)->
                                             zToken,iVar16,'\x01','\0');
        if (pFVar22 == (FuncDef *)0x0) {
          local_c8._0_1_ = 0;
          cVar44 = '\x01';
          bVar50 = true;
        }
        else {
          cVar44 = '\x01';
          bVar50 = true;
          local_c8._0_1_ = extraout_DL;
          if ((pFVar22->funcFlags & 4) != 0) {
            if (iVar16 < 3) {
              local_c8._0_1_ = 0;
LAB_00189904:
              pbVar24 = (byte *)pFVar22->pUserData;
              bVar12 = *pbVar24;
              bVar13 = pbVar24[1];
              in_R11B = pbVar24[2];
              cVar44 = (char)((pFVar22->funcFlags & 8) >> 3);
              bVar50 = false;
            }
            else {
              pSVar29 = ((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pSelect;
              pEVar27 = pSVar29->pOrderBy;
              local_c8._0_1_ = (byte)pSVar29;
              bVar50 = true;
              if ((char)pEVar27->nExpr == 'n') {
                pEVar23 = pEVar27->a[0].pExpr;
                local_c8._0_1_ = pEVar23->op;
                if ((byte)local_c8 == 0) goto LAB_00189a5a;
                bVar50 = true;
                if (pEVar23->affinity == '\0') goto LAB_00189904;
              }
            }
          }
        }
      }
    }
    bVar10 = true;
    if (bVar50) {
      p = (Expr *)0x0;
      bVar51 = false;
    }
    else {
      pEVar27 = ((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pList;
      pEVar23 = pEVar27->a[0].pExpr;
      while ((pEVar23 != (Expr *)0x0 && ((pEVar23->flags >> 0xc & 1) != 0))) {
        if ((pEVar23->flags >> 0x12 & 1) == 0) {
          pEVar32 = (ExprList_item *)&pEVar23->pLeft;
        }
        else {
          pEVar32 = ((pEVar23->x).pList)->a;
        }
        pEVar23 = pEVar32->pExpr;
      }
      pEVar26 = *(Expr **)(pEVar27 + 1);
      uVar46 = pEVar23->op;
      if ((uVar46 == 0x94) && ((psVar6->flags & 0x800000) == 0)) {
        sVar15 = pEVar23->iColumn;
        pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar15,'\0');
        if ((pVal == (sqlite3_value *)0x0) || ((pVal->flags & 0xf) != 2)) {
          pbVar24 = (byte *)0x0;
        }
        else {
          pbVar24 = (byte *)sqlite3ValueText(pVal,'\x01');
        }
        if (sVar15 < 0x20) {
          puVar1 = &pParse->pVdbe->expmask;
          *puVar1 = *puVar1 | 1 << ((char)sVar15 - 1U & 0x1f);
        }
        else {
          pbVar2 = (byte *)((long)&pParse->pVdbe->expmask + 3);
          *pbVar2 = *pbVar2 | 0x80;
        }
      }
      else if (uVar46 == 'n') {
        pbVar24 = (byte *)(pEVar23->u).zToken;
        pVal = (sqlite3_value *)0x0;
      }
      else {
        pVal = (sqlite3_value *)0x0;
        pbVar24 = (byte *)0x0;
      }
      if (pbVar24 == (byte *)0x0) {
LAB_00189c37:
        bVar10 = true;
        bVar51 = false;
        p = (Expr *)0x0;
      }
      else {
        bVar31 = *pbVar24;
        bVar50 = bVar31 == bVar12;
        if (((bVar31 == 0) || (bVar31 == bVar12)) || (bVar31 == bVar13)) {
          iVar16 = 0;
          lVar34 = 0;
        }
        else {
          iVar16 = 0;
          lVar34 = 0;
          if (bVar31 != in_R11B) {
            iVar16 = 0;
            do {
              uVar28 = (long)iVar16 + 1;
              if ((bVar31 == (byte)local_c8) && (pbVar24[uVar28] != 0)) {
                uVar28 = (ulong)(iVar16 + 2);
              }
              iVar16 = (int)uVar28;
              lVar34 = (long)iVar16;
              bVar31 = pbVar24[lVar34];
              bVar50 = bVar31 == bVar12;
            } while (((bVar31 != 0) && (bVar31 != bVar12)) &&
                    ((bVar31 != bVar13 && (bVar31 != in_R11B))));
          }
        }
        bVar10 = true;
        if (iVar16 == 0) {
          p = (Expr *)0x0;
          bVar51 = false;
        }
        else {
          if ((pbVar24[(long)iVar16 + -1] == 0xff) || ((iVar16 < 2 && (*pbVar24 == (byte)local_c8)))
             ) goto LAB_00189c37;
          bVar51 = false;
          if (bVar50) {
            bVar51 = pbVar24[(long)iVar16 + 1] == 0;
          }
          p = sqlite3Expr(psVar6,0x6e,(char *)pbVar24);
          if (p != (Expr *)0x0) {
            pbVar24 = (byte *)(p->u).zToken;
            pbVar24[lVar34] = 0;
            if (iVar16 < 1) {
              uVar28 = 0;
            }
            else {
              uVar28 = 0;
              iVar17 = 0;
              do {
                bVar12 = pbVar24[iVar17];
                pbVar24[uVar28] =
                     pbVar24[(int)(iVar17 + (uint)((int)(char)bVar12 == (uint)(byte)local_c8))];
                uVar28 = uVar28 + 1;
                iVar17 = iVar17 + (uint)((int)(char)bVar12 == (uint)(byte)local_c8) + 1;
              } while (iVar17 < iVar16);
            }
            pbVar24[uVar28 & 0xffffffff] = 0;
            bVar12 = *pbVar24;
            if ((((ulong)bVar12 - 0x30 < 10 || (ulong)bVar12 == 0x2d) ||
                ((int)uVar28 == 1 && bVar12 == 0x2f)) &&
               ((pEVar26->op != 0xa2 ||
                ((cVar11 = sqlite3ExprAffinity(pEVar26), cVar11 != 'B' ||
                 (((pEVar26->y).pTab)->nModuleArg != 0)))))) {
              sqlite3ExprDeleteNN(psVar6,p);
              p = (Expr *)0x0;
              goto LAB_0018a04a;
            }
          }
          if (uVar46 == 0x94) {
            pVVar7 = pParse->pVdbe;
            uVar4 = pEVar23->iColumn;
            uVar37 = 0x80000000;
            if ((short)uVar4 < 0x20) {
              uVar37 = 1 << ((char)uVar4 - 1U & 0x1f);
            }
            pVVar7->expmask = pVVar7->expmask | uVar37;
            if ((bVar51) && ((pEVar23->u).zToken[1] != '\0')) {
              if (pParse->nTempReg == '\0') {
                iVar16 = pParse->nMem + 1;
                pParse->nMem = iVar16;
              }
              else {
                bVar12 = pParse->nTempReg - 1;
                pParse->nTempReg = bVar12;
                iVar16 = pParse->aTempReg[bVar12];
              }
              sqlite3ExprCodeTarget(pParse,pEVar23,iVar16);
              if (pVVar7->db->mallocFailed == '\0') {
                pOVar30 = pVVar7->aOp + (long)pVVar7->nOp + -1;
              }
              else {
                pOVar30 = (Op *)&sqlite3VdbeGetOp_dummy;
              }
              pOVar30->p3 = 0;
              if (iVar16 != 0) {
                bVar12 = pParse->nTempReg;
                if ((ulong)bVar12 < 8) {
                  pParse->nTempReg = bVar12 + 1;
                  pParse->aTempReg[bVar12] = iVar16;
                }
              }
              bVar10 = false;
            }
            else {
              bVar10 = false;
            }
          }
          else {
            bVar10 = false;
          }
        }
      }
LAB_0018a04a:
      sqlite3ValueFree(pVal);
    }
    if (!bVar10) {
      pSVar42 = ((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pSelect->pSrc;
      if (p == (Expr *)0x0) {
        pEVar23 = (Expr *)0x0;
      }
      else {
        pEVar23 = exprDup(db,p,0,(u8 **)0x0);
      }
      if ((cVar44 == '\0') && (pParse->db->mallocFailed == '\0')) {
        pbVar24 = (byte *)((long)&pWVar40->wtFlags + 1);
        *pbVar24 = *pbVar24 | 4;
        pbVar24 = (byte *)(p->u).zToken;
        bVar12 = *pbVar24;
        if (bVar12 != 0) {
          lVar34 = 1;
          do {
            *pbVar24 = bVar12 & (~""[bVar12] | 0xdf);
            (pEVar23->u).zToken[lVar34 + -1] = ""[bVar12];
            bVar12 = (p->u).zToken[lVar34];
            pbVar24 = (byte *)((p->u).zToken + lVar34);
            lVar34 = lVar34 + 1;
          } while (bVar12 != 0);
        }
      }
      if (db->mallocFailed == '\0') {
        pcVar45 = (pEVar23->u).zToken;
        if (pcVar45 == (char *)0x0) {
          uVar28 = 0;
        }
        else {
          sVar25 = strlen(pcVar45);
          uVar28 = (ulong)((uint)sVar25 & 0x3fffffff);
        }
        bVar12 = pcVar45[uVar28 - 1];
        if (cVar44 == '\0') {
          if (bVar12 == 0x40) {
            bVar51 = false;
          }
          bVar12 = ""[bVar12];
        }
        pcVar45[uVar28 - 1] = bVar12 + 1;
      }
      pcVar45 = "NOCASE";
      if (cVar44 != '\0') {
        pcVar45 = "BINARY";
      }
      if (pSVar42 == (SrcList *)0x0) {
        pEVar26 = (Expr *)0x0;
      }
      else {
        pEVar26 = exprDup(db,(Expr *)pSVar42,0,(u8 **)0x0);
      }
      local_58.n = 6;
      local_58.z = pcVar45;
      pEVar26 = sqlite3ExprAddCollateToken(pParse,pEVar26,&local_58,0);
      pEVar26 = sqlite3PExpr(pParse,0x39,pEVar26,p);
      if (pEVar26 != (Expr *)0x0) {
        pEVar26->flags = pEVar26->flags | *(u32 *)((long)&(pIn->wc).pWInfo + 4) & 1;
        pEVar26->iRightJoinTable = *(i16 *)((long)&(pIn->wc).aStatic[0].pWC + 4);
      }
      iVar16 = whereClauseInsert(pWC,pEVar26,0x103);
      exprAnalyze(pSrc,pWC,iVar16);
      if (pSVar42 == (SrcList *)0x0) {
        pEVar26 = (Expr *)0x0;
      }
      else {
        pEVar26 = exprDup(db,(Expr *)pSVar42,0,(u8 **)0x0);
      }
      local_58.n = 6;
      local_58.z = pcVar45;
      pEVar26 = sqlite3ExprAddCollateToken(pParse,pEVar26,&local_58,0);
      pEVar23 = sqlite3PExpr(pParse,0x38,pEVar26,pEVar23);
      if (pEVar23 != (Expr *)0x0) {
        pEVar23->flags = pEVar23->flags | *(u32 *)((long)&(pIn->wc).pWInfo + 4) & 1;
        pEVar23->iRightJoinTable = *(i16 *)((long)&(pIn->wc).aStatic[0].pWC + 4);
      }
      iVar17 = whereClauseInsert(pWC,pEVar23,0x103);
      exprAnalyze(pSrc,pWC,iVar17);
      pWVar38 = pWC->a;
      pWVar40 = pWVar38 + idxTerm;
      if (bVar51) {
        pWVar38[iVar16].iParent = idxTerm;
        pWVar38[iVar16].truthProb = pWVar38[idxTerm].truthProb;
        uVar46 = pWVar38[idxTerm].nChild;
        pWVar38[idxTerm].nChild = uVar46 + '\x01';
        pWVar38[iVar17].iParent = idxTerm;
        pWVar38[iVar17].truthProb = pWVar38[idxTerm].truthProb;
        pWVar38[idxTerm].nChild = uVar46 + '\x02';
      }
    }
  }
  if (pWC->op == ',') {
    bVar12 = *(byte *)&(pIn->wc).pWInfo;
    if ((bVar12 - 0x33 < 2) || (bVar12 == 0xa0)) {
      pSVar42 = *(SrcList **)&(pIn->wc).op;
      p_00 = *(SrcList **)&(pIn->wc).nSlot;
      uVar37 = 0;
      if ((char)pSVar42->nSrc == -0x5e) {
        uVar37 = (uint)(*(int *)(*(long *)&pSVar42->a[0].regResult + 0x54) != 0);
      }
      uVar46 = '\0';
      pSVar41 = pSVar42;
      if (p_00 == (SrcList *)0x0) {
        p_00 = (SrcList *)0x0;
      }
      else if (((char)p_00->nSrc == -0x5e) && (*(int *)(*(long *)&p_00->a[0].regResult + 0x54) != 0)
              ) {
        uVar37 = uVar37 + 1;
        pSVar41 = p_00;
        p_00 = pSVar42;
      }
      if (bVar12 == 0x34) {
        uVar46 = 'D';
      }
      uVar36 = 'E';
      if (bVar12 != 0xa0) {
        uVar36 = uVar46;
      }
      uVar46 = 'F';
      if (bVar12 != 0x33) {
        uVar46 = uVar36;
      }
    }
    else {
      if (((bVar12 == 0xa1) &&
          (pSVar29 = ((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pSelect,
          pSVar29 != (Select *)0x0)) && (*(int *)&pSVar29->pEList == 2)) {
        pSVar41 = pSVar29->pSrc;
        if (((char)pSVar41->nSrc == -0x5e) &&
           (*(int *)(*(long *)&pSVar41->a[0].regResult + 0x54) != 0)) {
          pcVar45 = ((anon_union_8_2_443a03b8_for_u *)&(pIn->wc).pOuter)->zToken;
          lVar34 = 0;
          do {
            iVar16 = sqlite3StrICmp(pcVar45,*(char **)((long)&isAuxiliaryVtabOperator_aOp + lVar34))
            ;
            if (iVar16 == 0) {
              uVar46 = (&DAT_001d7798)[lVar34];
              p_00 = *(SrcList **)&pSVar29->op;
              goto LAB_0018a863;
            }
            lVar34 = lVar34 + 0x10;
          } while (lVar34 != 0x40);
        }
        pSVar41 = *(SrcList **)&pSVar29->op;
        if (((char)pSVar41->nSrc == -0x5e) &&
           (lVar34 = *(long *)&pSVar41->a[0].regResult, *(int *)(lVar34 + 0x54) != 0)) {
          for (puVar8 = *(undefined8 **)(lVar34 + 0x60);
              (puVar8 != (undefined8 *)0x0 && ((sqlite3 *)*puVar8 != db));
              puVar8 = (undefined8 *)puVar8[5]) {
          }
          pcVar9 = *(code **)(*(long *)puVar8[2] + 0x90);
          if ((pcVar9 != (code *)0x0) &&
             (iVar16 = (*pcVar9)((long *)puVar8[2],2,
                                 ((anon_union_8_2_443a03b8_for_u *)&(pIn->wc).pOuter)->zToken,
                                 &local_58,local_38), 0x95 < iVar16)) {
            uVar46 = (u8)iVar16;
            p_00 = pSVar29->pSrc;
LAB_0018a863:
            uVar37 = 1;
            goto LAB_0018a874;
          }
        }
      }
      p_00 = (SrcList *)0x0;
      pSVar41 = (SrcList *)0x0;
      uVar37 = 0;
      uVar46 = '\0';
    }
LAB_0018a874:
    if (uVar37 != 0) {
      iVar16 = uVar37 + 1;
      do {
        pSVar42 = pSVar41;
        if (p_00 == (SrcList *)0x0) {
          BVar20 = 0;
        }
        else {
          BVar20 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)p_00);
        }
        if (pSVar42 == (SrcList *)0x0) {
          uVar28 = 0;
        }
        else {
          uVar28 = sqlite3WhereExprUsageNN(pMaskSet,(Expr *)pSVar42);
        }
        if ((uVar28 & BVar20) == 0) {
          if (p_00 == (SrcList *)0x0) {
            pEVar23 = (Expr *)0x0;
          }
          else {
            pEVar23 = exprDup(db,(Expr *)p_00,0,(u8 **)0x0);
          }
          pEVar23 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar23);
          if ((((ulong)(pIn->wc).pWInfo & 0x100000000) != 0) && (pEVar23 != (Expr *)0x0)) {
            *(byte *)&pEVar23->flags = (byte)pEVar23->flags | 1;
          }
          iVar17 = whereClauseInsert(pWC,pEVar23,3);
          pWVar38 = pWC->a;
          pWVar38[iVar17].prereqRight = BVar20;
          pWVar38[iVar17].leftCursor = *(int *)((long)&pSVar42->a[0].pTab + 4);
          *(int *)&pWVar38[iVar17].u = (int)*(short *)&pSVar42->a[0].pSelect;
          pWVar38[iVar17].eOperator = 0x40;
          pWVar38[iVar17].eMatchOp = uVar46;
          pWVar47 = pWC->a;
          pWVar47[iVar17].iParent = idxTerm;
          pWVar47[iVar17].truthProb = pWVar47[idxTerm].truthProb;
          pWVar47[idxTerm].nChild = pWVar47[idxTerm].nChild + '\x01';
          *(byte *)&pWVar47[idxTerm].wtFlags = (byte)pWVar47[idxTerm].wtFlags | 8;
          pWVar40 = pWVar47 + idxTerm;
          pWVar38[iVar17].prereqAll = pWVar47[idxTerm].prereqAll;
        }
        iVar16 = iVar16 + -1;
        pSVar41 = p_00;
        p_00 = pSVar42;
      } while (1 < iVar16);
    }
  }
  if ((pWC->op != ',') || ((uVar46 = *(u8 *)&(pIn->wc).pWInfo, uVar46 != '5' && (uVar46 != '-'))))
  goto LAB_0018aae3;
  pEVar23 = *(Expr **)&(pIn->wc).op;
  uVar46 = pEVar23->op;
  if (uVar46 == 0xa8) {
    uVar46 = pEVar23->op2;
  }
  if (uVar46 == 0x83) {
    pSVar29 = (pEVar23->x).pSelect;
LAB_0018a9e5:
    iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar29->pEList)->pList->nExpr;
  }
  else {
    iVar16 = 1;
    if (uVar46 == 0xa9) {
      pSVar29 = (Select *)&pEVar23->x;
      goto LAB_0018a9e5;
    }
  }
  if (iVar16 < 2) goto LAB_0018aae3;
  pEVar26 = *(Expr **)&(pIn->wc).nSlot;
  uVar46 = pEVar26->op;
  if (uVar46 == 0xa8) {
    uVar46 = pEVar26->op2;
  }
  if (uVar46 == 0x83) {
    pSVar29 = (pEVar26->x).pSelect;
LAB_0018aa20:
    iVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar29->pEList)->pList->nExpr;
  }
  else {
    iVar17 = 1;
    if (uVar46 == 0xa9) {
      pSVar29 = (Select *)&pEVar26->x;
      goto LAB_0018aa20;
    }
  }
  if ((iVar17 == iVar16) && (((pEVar23->flags & 0x800) == 0 || ((pEVar26->flags & 0x800) == 0)))) {
    if (iVar16 < 2) {
      iVar16 = 1;
    }
    iVar17 = 0;
    do {
      pEVar23 = sqlite3ExprForVectorField(pParse,*(Expr **)&(pIn->wc).op,iVar17);
      pEVar26 = sqlite3ExprForVectorField(pParse,*(Expr **)&(pIn->wc).nSlot,iVar17);
      pEVar23 = sqlite3PExpr(pParse,(uint)*(byte *)&(pIn->wc).pWInfo,pEVar23,pEVar26);
      if (pEVar23 != (Expr *)0x0) {
        pEVar23->flags = pEVar23->flags | *(u32 *)((long)&(pIn->wc).pWInfo + 4) & 1;
        pEVar23->iRightJoinTable = *(i16 *)((long)&(pIn->wc).aStatic[0].pWC + 4);
      }
      iVar19 = whereClauseInsert(pWC,pEVar23,1);
      exprAnalyze(pSrc,pWC,iVar19);
      iVar17 = iVar17 + 1;
    } while (iVar16 != iVar17);
    pWVar38 = pWC->a;
    pWVar40 = pWVar38 + idxTerm;
    pWVar38[idxTerm].wtFlags = pWVar38[idxTerm].wtFlags | 6;
    pWVar38[idxTerm].eOperator = 0;
  }
LAB_0018aae3:
  if ((((pWC->op == ',') && (*(u8 *)&(pIn->wc).pWInfo == '1')) && (pWVar40->iField == 0)) &&
     (((*(Expr **)&(pIn->wc).op)->op == 0xa9 &&
      (((anon_union_8_2_a01b6dbf_for_x *)&(pIn->wc).a)->pSelect->pPrior == (Select *)0x0)))) {
    iVar16 = 1;
    do {
      pEVar23 = *(Expr **)&(pIn->wc).op;
      uVar46 = pEVar23->op;
      if (uVar46 == 0xa8) {
        uVar46 = pEVar23->op2;
      }
      if (uVar46 == 0x83) {
        pSVar29 = (pEVar23->x).pSelect;
LAB_0018ab59:
        iVar17 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar29->pEList)->pList->nExpr;
      }
      else {
        iVar17 = 1;
        if (uVar46 == 0xa9) {
          pSVar29 = (Select *)&pEVar23->x;
          goto LAB_0018ab59;
        }
      }
      if (iVar17 <= iVar16 + -1) break;
      iVar17 = whereClauseInsert(pWC,(Expr *)pIn,2);
      pWC->a[iVar17].iField = iVar16;
      exprAnalyze(pSrc,pWC,iVar17);
      pWVar40 = pWC->a;
      pWVar40[iVar17].iParent = idxTerm;
      pWVar40[iVar17].truthProb = pWVar40[idxTerm].truthProb;
      pWVar40[idxTerm].nChild = pWVar40[idxTerm].nChild + '\x01';
      iVar16 = iVar16 + 1;
    } while( true );
  }
  pBVar3 = &pWC->a[idxTerm].prereqRight;
  *pBVar3 = *pBVar3 | local_40;
  return;
}

Assistant:

static void exprAnalyze(
  SrcList *pSrc,            /* the FROM clause */
  WhereClause *pWC,         /* the WHERE clause */
  int idxTerm               /* Index of the term to be analyzed */
){
  WhereInfo *pWInfo = pWC->pWInfo; /* WHERE clause processing context */
  WhereTerm *pTerm;                /* The term to be analyzed */
  WhereMaskSet *pMaskSet;          /* Set of table index masks */
  Expr *pExpr;                     /* The expression to be analyzed */
  Bitmask prereqLeft;              /* Prerequesites of the pExpr->pLeft */
  Bitmask prereqAll;               /* Prerequesites of pExpr */
  Bitmask extraRight = 0;          /* Extra dependencies on LEFT JOIN */
  Expr *pStr1 = 0;                 /* RHS of LIKE/GLOB operator */
  int isComplete = 0;              /* RHS of LIKE/GLOB ends with wildcard */
  int noCase = 0;                  /* uppercase equivalent to lowercase */
  int op;                          /* Top-level operator.  pExpr->op */
  Parse *pParse = pWInfo->pParse;  /* Parsing context */
  sqlite3 *db = pParse->db;        /* Database connection */
  unsigned char eOp2 = 0;          /* op2 value for LIKE/REGEXP/GLOB */
  int nLeft;                       /* Number of elements on left side vector */

  if( db->mallocFailed ){
    return;
  }
  pTerm = &pWC->a[idxTerm];
  pMaskSet = &pWInfo->sMaskSet;
  pExpr = pTerm->pExpr;
  assert( pExpr->op!=TK_AS && pExpr->op!=TK_COLLATE );
  prereqLeft = sqlite3WhereExprUsage(pMaskSet, pExpr->pLeft);
  op = pExpr->op;
  if( op==TK_IN ){
    assert( pExpr->pRight==0 );
    if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      pTerm->prereqRight = exprSelectUsage(pMaskSet, pExpr->x.pSelect);
    }else{
      pTerm->prereqRight = sqlite3WhereExprListUsage(pMaskSet, pExpr->x.pList);
    }
  }else if( op==TK_ISNULL ){
    pTerm->prereqRight = 0;
  }else{
    pTerm->prereqRight = sqlite3WhereExprUsage(pMaskSet, pExpr->pRight);
  }
  pMaskSet->bVarSelect = 0;
  prereqAll = sqlite3WhereExprUsageNN(pMaskSet, pExpr);
  if( pMaskSet->bVarSelect ) pTerm->wtFlags |= TERM_VARSELECT;
  if( ExprHasProperty(pExpr, EP_FromJoin) ){
    Bitmask x = sqlite3WhereGetMask(pMaskSet, pExpr->iRightJoinTable);
    prereqAll |= x;
    extraRight = x-1;  /* ON clause terms may not be used with an index
                       ** on left table of a LEFT JOIN.  Ticket #3015 */
    if( (prereqAll>>1)>=x ){
      sqlite3ErrorMsg(pParse, "ON clause references tables to its right");
      return;
    }
  }
  pTerm->prereqAll = prereqAll;
  pTerm->leftCursor = -1;
  pTerm->iParent = -1;
  pTerm->eOperator = 0;
  if( allowedOp(op) ){
    int aiCurCol[2];
    Expr *pLeft = sqlite3ExprSkipCollate(pExpr->pLeft);
    Expr *pRight = sqlite3ExprSkipCollate(pExpr->pRight);
    u16 opMask = (pTerm->prereqRight & prereqLeft)==0 ? WO_ALL : WO_EQUIV;

    if( pTerm->iField>0 ){
      assert( op==TK_IN );
      assert( pLeft->op==TK_VECTOR );
      pLeft = pLeft->x.pList->a[pTerm->iField-1].pExpr;
    }

    if( exprMightBeIndexed(pSrc, prereqLeft, aiCurCol, pLeft, op) ){
      pTerm->leftCursor = aiCurCol[0];
      pTerm->u.leftColumn = aiCurCol[1];
      pTerm->eOperator = operatorMask(op) & opMask;
    }
    if( op==TK_IS ) pTerm->wtFlags |= TERM_IS;
    if( pRight 
     && exprMightBeIndexed(pSrc, pTerm->prereqRight, aiCurCol, pRight, op)
    ){
      WhereTerm *pNew;
      Expr *pDup;
      u16 eExtraOp = 0;        /* Extra bits for pNew->eOperator */
      assert( pTerm->iField==0 );
      if( pTerm->leftCursor>=0 ){
        int idxNew;
        pDup = sqlite3ExprDup(db, pExpr, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pDup);
          return;
        }
        idxNew = whereClauseInsert(pWC, pDup, TERM_VIRTUAL|TERM_DYNAMIC);
        if( idxNew==0 ) return;
        pNew = &pWC->a[idxNew];
        markTermAsChild(pWC, idxNew, idxTerm);
        if( op==TK_IS ) pNew->wtFlags |= TERM_IS;
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;

        if( termIsEquivalence(pParse, pDup) ){
          pTerm->eOperator |= WO_EQUIV;
          eExtraOp = WO_EQUIV;
        }
      }else{
        pDup = pExpr;
        pNew = pTerm;
      }
      exprCommute(pParse, pDup);
      pNew->leftCursor = aiCurCol[0];
      pNew->u.leftColumn = aiCurCol[1];
      testcase( (prereqLeft | extraRight) != prereqLeft );
      pNew->prereqRight = prereqLeft | extraRight;
      pNew->prereqAll = prereqAll;
      pNew->eOperator = (operatorMask(pDup->op) + eExtraOp) & opMask;
    }
  }

#ifndef SQLITE_OMIT_BETWEEN_OPTIMIZATION
  /* If a term is the BETWEEN operator, create two new virtual terms
  ** that define the range that the BETWEEN implements.  For example:
  **
  **      a BETWEEN b AND c
  **
  ** is converted into:
  **
  **      (a BETWEEN b AND c) AND (a>=b) AND (a<=c)
  **
  ** The two new terms are added onto the end of the WhereClause object.
  ** The new terms are "dynamic" and are children of the original BETWEEN
  ** term.  That means that if the BETWEEN term is coded, the children are
  ** skipped.  Or, if the children are satisfied by an index, the original
  ** BETWEEN term is skipped.
  */
  else if( pExpr->op==TK_BETWEEN && pWC->op==TK_AND ){
    ExprList *pList = pExpr->x.pList;
    int i;
    static const u8 ops[] = {TK_GE, TK_LE};
    assert( pList!=0 );
    assert( pList->nExpr==2 );
    for(i=0; i<2; i++){
      Expr *pNewExpr;
      int idxNew;
      pNewExpr = sqlite3PExpr(pParse, ops[i], 
                             sqlite3ExprDup(db, pExpr->pLeft, 0),
                             sqlite3ExprDup(db, pList->a[i].pExpr, 0));
      transferJoinMarkings(pNewExpr, pExpr);
      idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
      testcase( idxNew==0 );
      exprAnalyze(pSrc, pWC, idxNew);
      pTerm = &pWC->a[idxTerm];
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_BETWEEN_OPTIMIZATION */

#if !defined(SQLITE_OMIT_OR_OPTIMIZATION) && !defined(SQLITE_OMIT_SUBQUERY)
  /* Analyze a term that is composed of two or more subterms connected by
  ** an OR operator.
  */
  else if( pExpr->op==TK_OR ){
    assert( pWC->op==TK_AND );
    exprAnalyzeOrTerm(pSrc, pWC, idxTerm);
    pTerm = &pWC->a[idxTerm];
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */

#ifndef SQLITE_OMIT_LIKE_OPTIMIZATION
  /* Add constraints to reduce the search space on a LIKE or GLOB
  ** operator.
  **
  ** A like pattern of the form "x LIKE 'aBc%'" is changed into constraints
  **
  **          x>='ABC' AND x<'abd' AND x LIKE 'aBc%'
  **
  ** The last character of the prefix "abc" is incremented to form the
  ** termination condition "abd".  If case is not significant (the default
  ** for LIKE) then the lower-bound is made all uppercase and the upper-
  ** bound is made all lowercase so that the bounds also work when comparing
  ** BLOBs.
  */
  if( pWC->op==TK_AND 
   && isLikeOrGlob(pParse, pExpr, &pStr1, &isComplete, &noCase)
  ){
    Expr *pLeft;       /* LHS of LIKE/GLOB operator */
    Expr *pStr2;       /* Copy of pStr1 - RHS of LIKE/GLOB operator */
    Expr *pNewExpr1;
    Expr *pNewExpr2;
    int idxNew1;
    int idxNew2;
    const char *zCollSeqName;     /* Name of collating sequence */
    const u16 wtFlags = TERM_LIKEOPT | TERM_VIRTUAL | TERM_DYNAMIC;

    pLeft = pExpr->x.pList->a[1].pExpr;
    pStr2 = sqlite3ExprDup(db, pStr1, 0);

    /* Convert the lower bound to upper-case and the upper bound to
    ** lower-case (upper-case is less than lower-case in ASCII) so that
    ** the range constraints also work for BLOBs
    */
    if( noCase && !pParse->db->mallocFailed ){
      int i;
      char c;
      pTerm->wtFlags |= TERM_LIKE;
      for(i=0; (c = pStr1->u.zToken[i])!=0; i++){
        pStr1->u.zToken[i] = sqlite3Toupper(c);
        pStr2->u.zToken[i] = sqlite3Tolower(c);
      }
    }

    if( !db->mallocFailed ){
      u8 c, *pC;       /* Last character before the first wildcard */
      pC = (u8*)&pStr2->u.zToken[sqlite3Strlen30(pStr2->u.zToken)-1];
      c = *pC;
      if( noCase ){
        /* The point is to increment the last character before the first
        ** wildcard.  But if we increment '@', that will push it into the
        ** alphabetic range where case conversions will mess up the 
        ** inequality.  To avoid this, make sure to also run the full
        ** LIKE on all candidate expressions by clearing the isComplete flag
        */
        if( c=='A'-1 ) isComplete = 0;
        c = sqlite3UpperToLower[c];
      }
      *pC = c + 1;
    }
    zCollSeqName = noCase ? "NOCASE" : sqlite3StrBINARY;
    pNewExpr1 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr1 = sqlite3PExpr(pParse, TK_GE,
           sqlite3ExprAddCollateString(pParse,pNewExpr1,zCollSeqName),
           pStr1);
    transferJoinMarkings(pNewExpr1, pExpr);
    idxNew1 = whereClauseInsert(pWC, pNewExpr1, wtFlags);
    testcase( idxNew1==0 );
    exprAnalyze(pSrc, pWC, idxNew1);
    pNewExpr2 = sqlite3ExprDup(db, pLeft, 0);
    pNewExpr2 = sqlite3PExpr(pParse, TK_LT,
           sqlite3ExprAddCollateString(pParse,pNewExpr2,zCollSeqName),
           pStr2);
    transferJoinMarkings(pNewExpr2, pExpr);
    idxNew2 = whereClauseInsert(pWC, pNewExpr2, wtFlags);
    testcase( idxNew2==0 );
    exprAnalyze(pSrc, pWC, idxNew2);
    pTerm = &pWC->a[idxTerm];
    if( isComplete ){
      markTermAsChild(pWC, idxNew1, idxTerm);
      markTermAsChild(pWC, idxNew2, idxTerm);
    }
  }
#endif /* SQLITE_OMIT_LIKE_OPTIMIZATION */

#ifndef SQLITE_OMIT_VIRTUALTABLE
  /* Add a WO_AUX auxiliary term to the constraint set if the
  ** current expression is of the form "column OP expr" where OP
  ** is an operator that gets passed into virtual tables but which is
  ** not normally optimized for ordinary tables.  In other words, OP
  ** is one of MATCH, LIKE, GLOB, REGEXP, !=, IS, IS NOT, or NOT NULL.
  ** This information is used by the xBestIndex methods of
  ** virtual tables.  The native query optimizer does not attempt
  ** to do anything with MATCH functions.
  */
  if( pWC->op==TK_AND ){
    Expr *pRight = 0, *pLeft = 0;
    int res = isAuxiliaryVtabOperator(db, pExpr, &eOp2, &pLeft, &pRight);
    while( res-- > 0 ){
      int idxNew;
      WhereTerm *pNewTerm;
      Bitmask prereqColumn, prereqExpr;

      prereqExpr = sqlite3WhereExprUsage(pMaskSet, pRight);
      prereqColumn = sqlite3WhereExprUsage(pMaskSet, pLeft);
      if( (prereqExpr & prereqColumn)==0 ){
        Expr *pNewExpr;
        pNewExpr = sqlite3PExpr(pParse, TK_MATCH, 
            0, sqlite3ExprDup(db, pRight, 0));
        if( ExprHasProperty(pExpr, EP_FromJoin) && pNewExpr ){
          ExprSetProperty(pNewExpr, EP_FromJoin);
        }
        idxNew = whereClauseInsert(pWC, pNewExpr, TERM_VIRTUAL|TERM_DYNAMIC);
        testcase( idxNew==0 );
        pNewTerm = &pWC->a[idxNew];
        pNewTerm->prereqRight = prereqExpr;
        pNewTerm->leftCursor = pLeft->iTable;
        pNewTerm->u.leftColumn = pLeft->iColumn;
        pNewTerm->eOperator = WO_AUX;
        pNewTerm->eMatchOp = eOp2;
        markTermAsChild(pWC, idxNew, idxTerm);
        pTerm = &pWC->a[idxTerm];
        pTerm->wtFlags |= TERM_COPIED;
        pNewTerm->prereqAll = pTerm->prereqAll;
      }
      SWAP(Expr*, pLeft, pRight);
    }
  }
#endif /* SQLITE_OMIT_VIRTUALTABLE */

  /* If there is a vector == or IS term - e.g. "(a, b) == (?, ?)" - create
  ** new terms for each component comparison - "a = ?" and "b = ?".  The
  ** new terms completely replace the original vector comparison, which is
  ** no longer used.
  **
  ** This is only required if at least one side of the comparison operation
  ** is not a sub-select.  */
  if( pWC->op==TK_AND 
  && (pExpr->op==TK_EQ || pExpr->op==TK_IS)
  && (nLeft = sqlite3ExprVectorSize(pExpr->pLeft))>1
  && sqlite3ExprVectorSize(pExpr->pRight)==nLeft
  && ( (pExpr->pLeft->flags & EP_xIsSelect)==0 
    || (pExpr->pRight->flags & EP_xIsSelect)==0)
  ){
    int i;
    for(i=0; i<nLeft; i++){
      int idxNew;
      Expr *pNew;
      Expr *pLeft = sqlite3ExprForVectorField(pParse, pExpr->pLeft, i);
      Expr *pRight = sqlite3ExprForVectorField(pParse, pExpr->pRight, i);

      pNew = sqlite3PExpr(pParse, pExpr->op, pLeft, pRight);
      transferJoinMarkings(pNew, pExpr);
      idxNew = whereClauseInsert(pWC, pNew, TERM_DYNAMIC);
      exprAnalyze(pSrc, pWC, idxNew);
    }
    pTerm = &pWC->a[idxTerm];
    pTerm->wtFlags |= TERM_CODED|TERM_VIRTUAL;  /* Disable the original */
    pTerm->eOperator = 0;
  }

  /* If there is a vector IN term - e.g. "(a, b) IN (SELECT ...)" - create
  ** a virtual term for each vector component. The expression object
  ** used by each such virtual term is pExpr (the full vector IN(...) 
  ** expression). The WhereTerm.iField variable identifies the index within
  ** the vector on the LHS that the virtual term represents.
  **
  ** This only works if the RHS is a simple SELECT, not a compound
  */
  if( pWC->op==TK_AND && pExpr->op==TK_IN && pTerm->iField==0
   && pExpr->pLeft->op==TK_VECTOR
   && pExpr->x.pSelect->pPrior==0
  ){
    int i;
    for(i=0; i<sqlite3ExprVectorSize(pExpr->pLeft); i++){
      int idxNew;
      idxNew = whereClauseInsert(pWC, pExpr, TERM_VIRTUAL);
      pWC->a[idxNew].iField = i+1;
      exprAnalyze(pSrc, pWC, idxNew);
      markTermAsChild(pWC, idxNew, idxTerm);
    }
  }

#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  /* When sqlite_stat3 histogram data is available an operator of the
  ** form "x IS NOT NULL" can sometimes be evaluated more efficiently
  ** as "x>NULL" if x is not an INTEGER PRIMARY KEY.  So construct a
  ** virtual term of that form.
  **
  ** Note that the virtual term must be tagged with TERM_VNULL.
  */
  if( pExpr->op==TK_NOTNULL
   && pExpr->pLeft->op==TK_COLUMN
   && pExpr->pLeft->iColumn>=0
   && !ExprHasProperty(pExpr, EP_FromJoin)
   && OptimizationEnabled(db, SQLITE_Stat34)
  ){
    Expr *pNewExpr;
    Expr *pLeft = pExpr->pLeft;
    int idxNew;
    WhereTerm *pNewTerm;

    pNewExpr = sqlite3PExpr(pParse, TK_GT,
                            sqlite3ExprDup(db, pLeft, 0),
                            sqlite3ExprAlloc(db, TK_NULL, 0, 0));

    idxNew = whereClauseInsert(pWC, pNewExpr,
                              TERM_VIRTUAL|TERM_DYNAMIC|TERM_VNULL);
    if( idxNew ){
      pNewTerm = &pWC->a[idxNew];
      pNewTerm->prereqRight = 0;
      pNewTerm->leftCursor = pLeft->iTable;
      pNewTerm->u.leftColumn = pLeft->iColumn;
      pNewTerm->eOperator = WO_GT;
      markTermAsChild(pWC, idxNew, idxTerm);
      pTerm = &pWC->a[idxTerm];
      pTerm->wtFlags |= TERM_COPIED;
      pNewTerm->prereqAll = pTerm->prereqAll;
    }
  }
#endif /* SQLITE_ENABLE_STAT3_OR_STAT4 */

  /* Prevent ON clause terms of a LEFT JOIN from being used to drive
  ** an index for tables to the left of the join.
  */
  testcase( pTerm!=&pWC->a[idxTerm] );
  pTerm = &pWC->a[idxTerm];
  pTerm->prereqRight |= extraRight;
}